

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.h
# Opt level: O2

uint32_t __thiscall
spvtools::opt::CopyPropagateArrays::MemoryObject::GetPointerTypeId
          (MemoryObject *this,CopyPropagateArrays *pass)

{
  uint32_t uVar1;
  StorageClass storage_class;
  DefUseManager *this_00;
  TypeManager *this_01;
  Instruction *this_02;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_48;
  
  this_00 = IRContext::get_def_use_mgr(this->variable_inst_->context_);
  this_01 = IRContext::get_type_mgr(this->variable_inst_->context_);
  uVar1 = Instruction::type_id(this->variable_inst_);
  this_02 = analysis::DefUseManager::GetDef(this_00,uVar1);
  uVar1 = Instruction::GetSingleWordInOperand(this_02,1);
  GetAccessIds((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_48,this);
  uVar1 = GetMemberTypeId(pass,uVar1,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_48);
  storage_class = Instruction::GetSingleWordInOperand(this_02,0);
  uVar1 = analysis::TypeManager::FindPointerToType(this_01,uVar1,storage_class);
  return uVar1;
}

Assistant:

uint32_t GetPointerTypeId(const CopyPropagateArrays* pass) const {
      analysis::DefUseManager* def_use_mgr =
          GetVariable()->context()->get_def_use_mgr();
      analysis::TypeManager* type_mgr =
          GetVariable()->context()->get_type_mgr();

      Instruction* var_pointer_inst =
          def_use_mgr->GetDef(GetVariable()->type_id());

      uint32_t member_type_id = pass->GetMemberTypeId(
          var_pointer_inst->GetSingleWordInOperand(1), GetAccessIds());

      uint32_t member_pointer_type_id = type_mgr->FindPointerToType(
          member_type_id, static_cast<spv::StorageClass>(
                              var_pointer_inst->GetSingleWordInOperand(0)));
      return member_pointer_type_id;
    }